

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit.cpp
# Opt level: O2

void test_qpixl_frqi_compressedFRQICircuit<float>(void)

{
  undefined8 *puVar1;
  vector<float,_std::allocator<float>_> *a_00;
  vector<float,_std::allocator<float>_> *a_01;
  vector<float,_std::allocator<float>_> *a_02;
  long lVar2;
  long lVar3;
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  initializer_list<float> __l_01;
  undefined1 auStack_138 [16];
  SquareMatrix<float> circC_check;
  SquareMatrix<float> circA_check;
  QCircuit<float,_qclab::QObject<float>_> circC;
  QCircuit<float,_qclab::QObject<float>_> circB;
  SquareMatrix<float> circB_check;
  vector<float,_std::allocator<float>_> c;
  vector<float,_std::allocator<float>_> b;
  vector<float,_std::allocator<float>_> a;
  QCircuit<float,_qclab::QObject<float>_> circA;
  
  circA.super_QObject<float>._vptr_QObject = (_func_int **)0x3f8000003f000000;
  __l._M_len = 2;
  __l._M_array = (iterator)&circA;
  std::vector<float,_std::allocator<float>_>::vector(&a,__l,(allocator_type *)&circB);
  qpixl::frqi::compressedFRQICircuit<std::vector<float,std::allocator<float>>>
            (&circA,(frqi *)&a,a_00,0.0);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            (&circA_check,0.62054455,-0.33900505,0.62054455,-0.33900505,0.33900505,0.62054455,
             0.33900505,0.62054455,0.38205144,-0.59500986,-0.38205144,0.59500986,0.59500986,
             0.38205144,-0.59500986,-0.38205144);
  qclab::QCircuit<float,_qclab::QObject<float>_>::matrix(&circB);
  test_qpixl_frqi_check_matrix<qclab::dense::SquareMatrix<float>,qclab::dense::SquareMatrix<float>,float>
            ((SquareMatrix<float> *)&circB,&circA_check,1.1920929e-06);
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr
            ((unique_ptr<float[],_std::default_delete<float[]>_> *)&circB.super_QAdjustable);
  circB.super_QObject<float>._vptr_QObject = (_func_int **)0x3f8000003f000000;
  circB.super_QAdjustable.fixed_ = false;
  circB._9_3_ = 0x3fc000;
  circB.nbQubits_ = 0x40000000;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&circB;
  std::vector<float,_std::allocator<float>_>::vector(&b,__l_00,(allocator_type *)&circC);
  qpixl::frqi::compressedFRQICircuit<std::vector<float,std::allocator<float>>>
            (&circB,(frqi *)&b,a_01,0.0);
  qclab::dense::SquareMatrix<float>::SquareMatrix(&circB_check,8);
  *(undefined8 *)
   circB_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
   super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
   super__Head_base<0UL,_float_*,_false>._M_head_impl = 0x3e7577443ee0a940;
  *(undefined8 *)
   ((long)circB_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
          super__Head_base<0UL,_float_*,_false>._M_head_impl + 8) = 0x3ed76aa43e8a5140;
  *(undefined8 *)
   ((long)circB_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
          super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x10) = 0x3eff5bd53d10deaa;
  *(undefined8 *)
   ((long)circB_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
          super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x18) = 0x3ee8c7b7be551133;
  puVar1 = (undefined8 *)
           ((long)circB_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + circB_check.size_ * 4);
  *puVar1 = 0x3ee0a940be757744;
  puVar1[1] = 0x3e8a5140bed76aa4;
  puVar1 = (undefined8 *)
           ((long)circB_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x10 + circB_check.size_ * 4)
  ;
  *puVar1 = 0x3d10deaabeff5bd5;
  puVar1[1] = 0xbe551133bee8c7b7;
  puVar1 = (undefined8 *)
           ((long)circB_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + circB_check.size_ * 8);
  *puVar1 = 0x3e7577443ee0a940;
  puVar1[1] = 0xbed76aa4be8a5140;
  puVar1 = (undefined8 *)
           ((long)circB_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x10 + circB_check.size_ * 8)
  ;
  *puVar1 = 0x3eff5bd53d10deaa;
  puVar1[1] = 0xbee8c7b73e551133;
  puVar1 = (undefined8 *)
           ((long)circB_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + circB_check.size_ * 0xc);
  *puVar1 = 0x3ee0a940be757744;
  puVar1[1] = 0xbe8a51403ed76aa4;
  puVar1 = (undefined8 *)
           ((long)circB_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x10 +
           circB_check.size_ * 0xc);
  *puVar1 = 0x3d10deaabeff5bd5;
  puVar1[1] = 0x3e5511333ee8c7b7;
  puVar1 = (undefined8 *)
           ((long)circB_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + circB_check.size_ * 0x10);
  *puVar1 = 0x3e7577443ee0a940;
  puVar1[1] = 0x3ed76aa43e8a5140;
  puVar1 = (undefined8 *)
           ((long)circB_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x10 +
           circB_check.size_ * 0x10);
  *puVar1 = 0xbeff5bd5bd10deaa;
  puVar1[1] = 0xbee8c7b73e551133;
  puVar1 = (undefined8 *)
           ((long)circB_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + circB_check.size_ * 0x14);
  *puVar1 = 0x3ee0a940be757744;
  puVar1[1] = 0x3e8a5140bed76aa4;
  puVar1 = (undefined8 *)
           ((long)circB_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x10 +
           circB_check.size_ * 0x14);
  *puVar1 = 0xbd10deaa3eff5bd5;
  puVar1[1] = 0x3e5511333ee8c7b7;
  puVar1 = (undefined8 *)
           ((long)circB_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + circB_check.size_ * 0x18);
  *puVar1 = 0x3e7577443ee0a940;
  puVar1[1] = 0xbed76aa4be8a5140;
  puVar1 = (undefined8 *)
           ((long)circB_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x10 +
           circB_check.size_ * 0x18);
  *puVar1 = 0xbeff5bd5bd10deaa;
  puVar1[1] = 0x3ee8c7b7be551133;
  puVar1 = (undefined8 *)
           ((long)circB_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + circB_check.size_ * 0x1c);
  *puVar1 = 0x3ee0a940be757744;
  puVar1[1] = 0xbe8a51403ed76aa4;
  puVar1 = (undefined8 *)
           ((long)circB_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x10 +
           circB_check.size_ * 0x1c);
  *puVar1 = 0xbd10deaa3eff5bd5;
  puVar1[1] = 0xbe551133bee8c7b7;
  qclab::QCircuit<float,_qclab::QObject<float>_>::matrix(&circC);
  test_qpixl_frqi_check_matrix<qclab::dense::SquareMatrix<float>,qclab::dense::SquareMatrix<float>,float>
            ((SquareMatrix<float> *)&circC,&circB_check,1.1920929e-06);
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr
            ((unique_ptr<float[],_std::default_delete<float[]>_> *)&circC.super_QAdjustable);
  circC.offset_ = 0x40200000;
  circC._20_4_ = 0x40400000;
  circC.gates_.
  super__Vector_base<std::unique_ptr<qclab::QObject<float>,_std::default_delete<qclab::QObject<float>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<float>,_std::default_delete<qclab::QObject<float>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x4080000040600000;
  circC.super_QObject<float>._vptr_QObject = (_func_int **)0x3f8000003f000000;
  circC.super_QAdjustable.fixed_ = false;
  circC._9_3_ = 0x3fc000;
  circC.nbQubits_ = 0x40000000;
  __l_01._M_len = 8;
  __l_01._M_array = (iterator)&circC;
  std::vector<float,_std::allocator<float>_>::vector(&c,__l_01,(allocator_type *)&circC_check);
  qpixl::frqi::compressedFRQICircuit<std::vector<float,std::allocator<float>>>
            (&circC,(frqi *)&c,a_02,0.0);
  qclab::dense::SquareMatrix<float>::SquareMatrix(&circC_check,0x10);
  *(undefined8 *)
   circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
   super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
   super__Head_base<0UL,_float_*,_false>._M_head_impl = 0x3e2d92123e9edc02;
  *(undefined8 *)
   ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
          super__Head_base<0UL,_float_*,_false>._M_head_impl + 8) = 0x3e9852913e439c3f;
  *(undefined8 *)
   ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
          super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x10) = 0x3eb490de3ccce077;
  *(undefined8 *)
   ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
          super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x18) = 0x3ea499b5be16a948;
  *(undefined8 *)
   ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
          super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x20) = 0x3e58ab89be9105c2;
  *(undefined8 *)
   ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
          super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x28) = 0x3d4c5d15beb33531;
  *(undefined8 *)
   ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
          super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x30) = 0xbdfdfe83bea9844b;
  *(undefined8 *)
   ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
          super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x38) = 0xbe88fef2be6ca4ef;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + circC_check.size_ * 4);
  *puVar1 = 0x3e9edc02be2d9212;
  puVar1[1] = 0x3e439c3fbe985291;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x10 + circC_check.size_ * 4)
  ;
  *puVar1 = 0x3ccce077beb490de;
  puVar1[1] = 0xbe16a948bea499b5;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x20 + circC_check.size_ * 4)
  ;
  *puVar1 = 0xbe9105c2be58ab89;
  puVar1[1] = 0xbeb33531bd4c5d15;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x30 + circC_check.size_ * 4)
  ;
  *puVar1 = 0xbea9844b3dfdfe83;
  puVar1[1] = 0xbe6ca4ef3e88fef2;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + circC_check.size_ * 8);
  *puVar1 = 0x3e2d92123e9edc02;
  puVar1[1] = 0xbe985291be439c3f;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x10 + circC_check.size_ * 8)
  ;
  *puVar1 = 0x3eb490de3ccce077;
  puVar1[1] = 0xbea499b53e16a948;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x20 + circC_check.size_ * 8)
  ;
  *puVar1 = 0x3e58ab89be9105c2;
  puVar1[1] = 0xbd4c5d153eb33531;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x30 + circC_check.size_ * 8)
  ;
  *puVar1 = 0xbdfdfe83bea9844b;
  puVar1[1] = 0x3e88fef23e6ca4ef;
  lVar2 = circC_check.size_ * 0xc;
  *(undefined8 *)
   ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
          super__Head_base<0UL,_float_*,_false>._M_head_impl + lVar2) = 0x3e9edc02be2d9212;
  ((undefined8 *)
  ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
         super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
         super__Head_base<0UL,_float_*,_false>._M_head_impl + lVar2))[1] = 0xbe439c3f3e985291;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x10 + lVar2);
  *puVar1 = 0x3ccce077beb490de;
  puVar1[1] = 0x3e16a9483ea499b5;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x20 + lVar2);
  *puVar1 = 0xbe9105c2be58ab89;
  puVar1[1] = 0x3eb335313d4c5d15;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x30 + lVar2);
  *puVar1 = 0xbea9844b3dfdfe83;
  puVar1[1] = 0x3e6ca4efbe88fef2;
  lVar2 = circC_check.size_ * 0x10;
  *(undefined8 *)
   ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
          super__Head_base<0UL,_float_*,_false>._M_head_impl + lVar2) = 0x3e2d92123e9edc02;
  ((undefined8 *)
  ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
         super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
         super__Head_base<0UL,_float_*,_false>._M_head_impl + lVar2))[1] = 0x3e9852913e439c3f;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x10 + lVar2);
  *puVar1 = 0xbeb490debccce077;
  puVar1[1] = 0xbea499b53e16a948;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x20 + lVar2);
  *puVar1 = 0x3e58ab89be9105c2;
  puVar1[1] = 0x3d4c5d15beb33531;
  lVar3 = circC_check.size_ * 0x14;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x30 + lVar2);
  *puVar1 = 0x3dfdfe833ea9844b;
  puVar1[1] = 0x3e88fef23e6ca4ef;
  *(undefined8 *)
   ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
          super__Head_base<0UL,_float_*,_false>._M_head_impl + lVar3) = 0x3e9edc02be2d9212;
  ((undefined8 *)
  ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
         super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
         super__Head_base<0UL,_float_*,_false>._M_head_impl + lVar3))[1] = 0x3e439c3fbe985291;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x10 + lVar3);
  *puVar1 = 0xbccce0773eb490de;
  puVar1[1] = 0x3e16a9483ea499b5;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x20 + lVar3);
  *puVar1 = 0xbe9105c2be58ab89;
  puVar1[1] = 0xbeb33531bd4c5d15;
  lVar2 = circC_check.size_ * 0x18;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x30 + lVar3);
  *puVar1 = 0x3ea9844bbdfdfe83;
  puVar1[1] = 0x3e6ca4efbe88fef2;
  *(undefined8 *)
   ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
          super__Head_base<0UL,_float_*,_false>._M_head_impl + lVar2) = 0x3e2d92123e9edc02;
  ((undefined8 *)
  ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
         super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
         super__Head_base<0UL,_float_*,_false>._M_head_impl + lVar2))[1] = 0xbe985291be439c3f;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x10 + lVar2);
  *puVar1 = 0xbeb490debccce077;
  puVar1[1] = 0x3ea499b5be16a948;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x20 + lVar2);
  *puVar1 = 0x3e58ab89be9105c2;
  puVar1[1] = 0xbd4c5d153eb33531;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x30 + lVar2);
  *puVar1 = 0x3dfdfe833ea9844b;
  puVar1[1] = 0xbe88fef2be6ca4ef;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + circC_check.size_ * 0x1c);
  *puVar1 = 0x3e9edc02be2d9212;
  puVar1[1] = 0xbe439c3f3e985291;
  lVar2 = circC_check.size_ * 0x1c;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x10 + lVar2);
  *puVar1 = 0xbccce0773eb490de;
  puVar1[1] = 0xbe16a948bea499b5;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x20 + lVar2);
  *puVar1 = 0xbe9105c2be58ab89;
  puVar1[1] = 0x3eb335313d4c5d15;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x30 + lVar2);
  *puVar1 = 0x3ea9844bbdfdfe83;
  puVar1[1] = 0xbe6ca4ef3e88fef2;
  lVar2 = circC_check.size_ * 0x20;
  *(undefined8 *)
   ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
          super__Head_base<0UL,_float_*,_false>._M_head_impl + lVar2) = 0x3e2d92123e9edc02;
  ((undefined8 *)
  ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
         super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
         super__Head_base<0UL,_float_*,_false>._M_head_impl + lVar2))[1] = 0x3e9852913e439c3f;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x10 + lVar2);
  *puVar1 = 0x3eb490de3ccce077;
  puVar1[1] = 0x3ea499b5be16a948;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x20 + lVar2);
  *puVar1 = 0xbe58ab893e9105c2;
  puVar1[1] = 0xbd4c5d153eb33531;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x30 + lVar2);
  *puVar1 = 0x3dfdfe833ea9844b;
  puVar1[1] = 0x3e88fef23e6ca4ef;
  lVar2 = circC_check.size_ * 0x24;
  *(undefined8 *)
   ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
          super__Head_base<0UL,_float_*,_false>._M_head_impl + lVar2) = 0x3e9edc02be2d9212;
  ((undefined8 *)
  ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
         super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
         super__Head_base<0UL,_float_*,_false>._M_head_impl + lVar2))[1] = 0x3e439c3fbe985291;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x10 + lVar2);
  *puVar1 = 0x3ccce077beb490de;
  puVar1[1] = 0xbe16a948bea499b5;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x20 + lVar2);
  *puVar1 = 0x3e9105c23e58ab89;
  puVar1[1] = 0x3eb335313d4c5d15;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x30 + lVar2);
  *puVar1 = 0x3ea9844bbdfdfe83;
  puVar1[1] = 0x3e6ca4efbe88fef2;
  lVar2 = circC_check.size_ * 0x28;
  *(undefined8 *)
   ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
          super__Head_base<0UL,_float_*,_false>._M_head_impl + lVar2) = 0x3e2d92123e9edc02;
  ((undefined8 *)
  ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
         super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
         super__Head_base<0UL,_float_*,_false>._M_head_impl + lVar2))[1] = 0xbe985291be439c3f;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x10 + lVar2);
  *puVar1 = 0x3eb490de3ccce077;
  puVar1[1] = 0xbea499b53e16a948;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x20 + lVar2);
  *puVar1 = 0xbe58ab893e9105c2;
  puVar1[1] = 0x3d4c5d15beb33531;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x30 + lVar2);
  *puVar1 = 0x3dfdfe833ea9844b;
  puVar1[1] = 0xbe88fef2be6ca4ef;
  lVar2 = circC_check.size_ * 0x2c;
  *(undefined8 *)
   ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
          super__Head_base<0UL,_float_*,_false>._M_head_impl + lVar2) = 0x3e9edc02be2d9212;
  ((undefined8 *)
  ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
         super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
         super__Head_base<0UL,_float_*,_false>._M_head_impl + lVar2))[1] = 0xbe439c3f3e985291;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x10 + lVar2);
  *puVar1 = 0x3ccce077beb490de;
  puVar1[1] = 0x3e16a9483ea499b5;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x20 + lVar2);
  *puVar1 = 0x3e9105c23e58ab89;
  puVar1[1] = 0xbeb33531bd4c5d15;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x30 + lVar2);
  *puVar1 = 0x3ea9844bbdfdfe83;
  puVar1[1] = 0xbe6ca4ef3e88fef2;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + circC_check.size_ * 0x30);
  *puVar1 = 0x3e2d92123e9edc02;
  puVar1[1] = 0x3e9852913e439c3f;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x10 +
           circC_check.size_ * 0x30);
  *puVar1 = 0xbeb490debccce077;
  puVar1[1] = 0xbea499b53e16a948;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x20 +
           circC_check.size_ * 0x30);
  *puVar1 = 0xbe58ab893e9105c2;
  puVar1[1] = 0xbd4c5d153eb33531;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x30 +
           circC_check.size_ * 0x30);
  *puVar1 = 0xbdfdfe83bea9844b;
  puVar1[1] = 0xbe88fef2be6ca4ef;
  lVar2 = circC_check.size_ * 0x34;
  *(undefined8 *)
   ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
          super__Head_base<0UL,_float_*,_false>._M_head_impl + lVar2) = 0x3e9edc02be2d9212;
  ((undefined8 *)
  ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
         super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
         super__Head_base<0UL,_float_*,_false>._M_head_impl + lVar2))[1] = 0x3e439c3fbe985291;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x10 + lVar2);
  *puVar1 = 0xbccce0773eb490de;
  puVar1[1] = 0x3e16a9483ea499b5;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x20 + lVar2);
  *puVar1 = 0x3e9105c23e58ab89;
  puVar1[1] = 0x3eb335313d4c5d15;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x30 + lVar2);
  *puVar1 = 0xbea9844b3dfdfe83;
  puVar1[1] = 0xbe6ca4ef3e88fef2;
  lVar2 = circC_check.size_ * 0x38;
  *(undefined8 *)
   ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
          super__Head_base<0UL,_float_*,_false>._M_head_impl + lVar2) = 0x3e2d92123e9edc02;
  ((undefined8 *)
  ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
         super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
         super__Head_base<0UL,_float_*,_false>._M_head_impl + lVar2))[1] = 0xbe985291be439c3f;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x10 + lVar2);
  *puVar1 = 0xbeb490debccce077;
  puVar1[1] = 0x3ea499b5be16a948;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x20 + lVar2);
  *puVar1 = 0xbe58ab893e9105c2;
  puVar1[1] = 0x3d4c5d15beb33531;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x30 + lVar2);
  *puVar1 = 0xbdfdfe83bea9844b;
  puVar1[1] = 0x3e88fef23e6ca4ef;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + circC_check.size_ * 0x3c);
  *puVar1 = 0x3e9edc02be2d9212;
  puVar1[1] = 0xbe439c3f3e985291;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x10 +
           circC_check.size_ * 0x3c);
  *puVar1 = 0xbccce0773eb490de;
  puVar1[1] = 0xbe16a948bea499b5;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x20 +
           circC_check.size_ * 0x3c);
  *puVar1 = 0x3e9105c23e58ab89;
  puVar1[1] = 0xbeb33531bd4c5d15;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                  ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x30 +
           circC_check.size_ * 0x3c);
  *puVar1 = 0xbea9844b3dfdfe83;
  puVar1[1] = 0x3e6ca4efbe88fef2;
  qclab::QCircuit<float,_qclab::QObject<float>_>::matrix
            ((QCircuit<float,_qclab::QObject<float>_> *)auStack_138);
  test_qpixl_frqi_check_matrix<qclab::dense::SquareMatrix<float>,qclab::dense::SquareMatrix<float>,float>
            ((SquareMatrix<float> *)auStack_138,&circC_check,1.1920929e-06);
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr
            ((unique_ptr<float[],_std::default_delete<float[]>_> *)(auStack_138 + 8));
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&circC_check.data_);
  qclab::QCircuit<float,_qclab::QObject<float>_>::~QCircuit(&circC);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&c.super__Vector_base<float,_std::allocator<float>_>);
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&circB_check.data_);
  qclab::QCircuit<float,_qclab::QObject<float>_>::~QCircuit(&circB);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&b.super__Vector_base<float,_std::allocator<float>_>);
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&circA_check.data_);
  qclab::QCircuit<float,_qclab::QObject<float>_>::~QCircuit(&circA);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&a.super__Vector_base<float,_std::allocator<float>_>);
  return;
}

Assistant:

void test_qpixl_frqi_compressedFRQICircuit() {
  const R eps = std::numeric_limits< R >::epsilon() ;

  std::vector< R > a = { 0.5 , 1 } ;

  auto circA = qpixl::frqi::compressedFRQICircuit( a ) ;

  // matrix
  qclab::dense::SquareMatrix< R > circA_check(    
  0.620544580563746, -0.339005049421045,  0.620544580563746, -0.339005049421045,
  0.339005049421045,  0.620544580563746,  0.339005049421045,  0.620544580563746,
  0.382051424370090, -0.595009839529386, -0.382051424370090,  0.595009839529386,
  0.595009839529386,  0.382051424370090, -0.595009839529386, -0.382051424370090
  ) ;

  test_qpixl_frqi_check_matrix( circA.matrix() , circA_check  , 10*eps );
  
  
  std::vector< R > b = { 0.5 , 1 , 1.5 , 2 };

  auto circB = qpixl::frqi::compressedFRQICircuit( b ) ;

  // matrix
  qclab::dense::SquareMatrix< R > circB_check( 8 ) ;

  circB_check( 0, 0 ) =  0.438791280945186 ;
  circB_check( 1, 0 ) =  0.239712769302101 ;
  circB_check( 2, 0 ) =  0.270151152934070 ;
  circB_check( 3, 0 ) =  0.420735492403948 ;
  circB_check( 4, 0 ) =  0.035368600833851 ;
  circB_check( 5, 0 ) =  0.498747493302027 ;
  circB_check( 6, 0 ) = -0.208073418273571 ;
  circB_check( 7, 0 ) =  0.454648713412841 ;

  circB_check( 0, 1 ) = -0.239712769302101 ;
  circB_check( 1, 1 ) =  0.438791280945186 ;
  circB_check( 2, 1 ) = -0.420735492403948 ;
  circB_check( 3, 1 ) =  0.270151152934070 ;
  circB_check( 4, 1 ) = -0.498747493302027 ;
  circB_check( 5, 1 ) =  0.035368600833851 ;
  circB_check( 6, 1 ) = -0.454648713412841 ;
  circB_check( 7, 1 ) = -0.208073418273571 ;

  circB_check( 0, 2 ) =  0.438791280945186 ;
  circB_check( 1, 2 ) =  0.239712769302101 ;
  circB_check( 2, 2 ) = -0.270151152934070 ;
  circB_check( 3, 2 ) = -0.420735492403948 ;
  circB_check( 4, 2 ) =  0.035368600833851 ;
  circB_check( 5, 2 ) =  0.498747493302027 ;
  circB_check( 6, 2 ) =  0.208073418273571 ;
  circB_check( 7, 2 ) = -0.454648713412841 ;

  circB_check( 0, 3 ) = -0.239712769302101 ;
  circB_check( 1, 3 ) =  0.438791280945186 ;
  circB_check( 2, 3 ) =  0.420735492403948 ;
  circB_check( 3, 3 ) = -0.270151152934070 ;
  circB_check( 4, 3 ) = -0.498747493302027 ;
  circB_check( 5, 3 ) =  0.035368600833851 ;
  circB_check( 6, 3 ) =  0.454648713412841 ;
  circB_check( 7, 3 ) =  0.208073418273571 ;

  circB_check( 0, 4 ) =  0.438791280945186 ;
  circB_check( 1, 4 ) =  0.239712769302101 ;
  circB_check( 2, 4 ) =  0.270151152934070 ;
  circB_check( 3, 4 ) =  0.420735492403948 ;
  circB_check( 4, 4 ) = -0.035368600833851 ;
  circB_check( 5, 4 ) = -0.498747493302027 ;
  circB_check( 6, 4 ) =  0.208073418273571 ;
  circB_check( 7, 4 ) = -0.454648713412841 ;

  circB_check( 0, 5 ) = -0.239712769302101 ;
  circB_check( 1, 5 ) =  0.438791280945186 ;
  circB_check( 2, 5 ) = -0.420735492403948 ;
  circB_check( 3, 5 ) =  0.270151152934070 ;
  circB_check( 4, 5 ) =  0.498747493302027 ;
  circB_check( 5, 5 ) = -0.035368600833851 ;
  circB_check( 6, 5 ) =  0.454648713412841 ;
  circB_check( 7, 5 ) =  0.208073418273571 ;

  circB_check( 0, 6 ) =  0.438791280945186 ;
  circB_check( 1, 6 ) =  0.239712769302101 ;
  circB_check( 2, 6 ) = -0.270151152934070 ;
  circB_check( 3, 6 ) = -0.420735492403948 ;
  circB_check( 4, 6 ) = -0.035368600833851 ;
  circB_check( 5, 6 ) = -0.498747493302027 ;
  circB_check( 6, 6 ) = -0.208073418273571 ;
  circB_check( 7, 6 ) =  0.454648713412841 ;

  circB_check( 0, 7 ) = -0.239712769302101 ;
  circB_check( 1, 7 ) =  0.438791280945186 ;
  circB_check( 2, 7 ) =  0.420735492403948 ;
  circB_check( 3, 7 ) = -0.270151152934070 ;
  circB_check( 4, 7 ) =  0.498747493302027 ;
  circB_check( 5, 7 ) = -0.035368600833851 ;
  circB_check( 6, 7 ) = -0.454648713412841 ;
  circB_check( 7, 7 ) = -0.208073418273571 ;


  test_qpixl_frqi_check_matrix( circB.matrix() , circB_check  , 10*eps );



  std::vector< R > c = { 0.5 , 1 , 1.5 , 2 , 2.5 , 3 , 3.5 , 4 };

  auto circC = qpixl::frqi::compressedFRQICircuit( c ) ;  

  // matrix
  qclab::dense::SquareMatrix< R > circC_check( 16 ) ;

  circC_check(  0, 0 ) =    0.310272290281873 ;
  circC_check(  1, 0 ) =    0.169502524710522 ;
  circC_check(  2, 0 ) =    0.191025712185045 ;
  circC_check(  3, 0 ) =    0.297504919764693 ;
  circC_check(  4, 0 ) =    0.025009377490697 ;
  circC_check(  5, 0 ) =    0.352667734613656 ;
  circC_check(  6, 0 ) =   -0.147130125045907 ;
  circC_check(  7, 0 ) =    0.321485188311959 ;
  circC_check(  8, 0 ) =   -0.283247041628773 ;
  circC_check(  9, 0 ) =    0.211591855723580 ;
  circC_check( 10, 0 ) =   -0.350015203834987 ;
  circC_check( 11, 0 ) =    0.049893457330116 ;
  circC_check( 12, 0 ) =   -0.331087436935406 ;
  circC_check( 13, 0 ) =   -0.124020599512917 ;
  circC_check( 14, 0 ) =   -0.231097918395994 ;
  circC_check( 15, 0 ) =   -0.267570088225568 ;

  circC_check(  0, 1 ) =   -0.169502524710522 ;
  circC_check(  1, 1 ) =    0.310272290281873 ;
  circC_check(  2, 1 ) =   -0.297504919764693 ;
  circC_check(  3, 1 ) =    0.191025712185045 ;
  circC_check(  4, 1 ) =   -0.352667734613656 ;
  circC_check(  5, 1 ) =    0.025009377490697 ;
  circC_check(  6, 1 ) =   -0.321485188311959 ;
  circC_check(  7, 1 ) =   -0.147130125045907 ;
  circC_check(  8, 1 ) =   -0.211591855723580 ;
  circC_check(  9, 1 ) =   -0.283247041628773 ;
  circC_check( 10, 1 ) =   -0.049893457330116 ;
  circC_check( 11, 1 ) =   -0.350015203834987 ;
  circC_check( 12, 1 ) =    0.124020599512917 ;
  circC_check( 13, 1 ) =   -0.331087436935406 ;
  circC_check( 14, 1 ) =    0.267570088225568 ;
  circC_check( 15, 1 ) =   -0.231097918395994 ;

  circC_check(  0, 2 ) =    0.310272290281873 ;
  circC_check(  1, 2 ) =    0.169502524710522 ;
  circC_check(  2, 2 ) =   -0.191025712185045 ;
  circC_check(  3, 2 ) =   -0.297504919764693 ;
  circC_check(  4, 2 ) =    0.025009377490697 ;
  circC_check(  5, 2 ) =    0.352667734613656 ;
  circC_check(  6, 2 ) =    0.147130125045907 ;
  circC_check(  7, 2 ) =   -0.321485188311959 ;
  circC_check(  8, 2 ) =   -0.283247041628773 ;
  circC_check(  9, 2 ) =    0.211591855723580 ;
  circC_check( 10, 2 ) =    0.350015203834987 ;
  circC_check( 11, 2 ) =   -0.049893457330116 ;
  circC_check( 12, 2 ) =   -0.331087436935406 ;
  circC_check( 13, 2 ) =   -0.124020599512917 ;
  circC_check( 14, 2 ) =    0.231097918395994 ;
  circC_check( 15, 2 ) =    0.267570088225568 ;

  circC_check(  0, 3 ) =   -0.169502524710522 ;
  circC_check(  1, 3 ) =    0.310272290281873 ;
  circC_check(  2, 3 ) =    0.297504919764693 ;
  circC_check(  3, 3 ) =   -0.191025712185045 ;
  circC_check(  4, 3 ) =   -0.352667734613656 ;
  circC_check(  5, 3 ) =    0.025009377490697 ;
  circC_check(  6, 3 ) =    0.321485188311959 ;
  circC_check(  7, 3 ) =    0.147130125045907 ;
  circC_check(  8, 3 ) =   -0.211591855723580 ;
  circC_check(  9, 3 ) =   -0.283247041628773 ;
  circC_check( 10, 3 ) =    0.049893457330116 ;
  circC_check( 11, 3 ) =    0.350015203834987 ;
  circC_check( 12, 3 ) =    0.124020599512917 ;
  circC_check( 13, 3 ) =   -0.331087436935406 ;
  circC_check( 14, 3 ) =   -0.267570088225568 ;
  circC_check( 15, 3 ) =    0.231097918395994 ;

  circC_check(  0, 4 ) =    0.310272290281873 ;
  circC_check(  1, 4 ) =    0.169502524710522 ;
  circC_check(  2, 4 ) =    0.191025712185045 ;
  circC_check(  3, 4 ) =    0.297504919764693 ;
  circC_check(  4, 4 ) =   -0.025009377490697 ;
  circC_check(  5, 4 ) =   -0.352667734613656 ;
  circC_check(  6, 4 ) =    0.147130125045907 ;
  circC_check(  7, 4 ) =   -0.321485188311959 ;
  circC_check(  8, 4 ) =   -0.283247041628773 ;
  circC_check(  9, 4 ) =    0.211591855723580 ;
  circC_check( 10, 4 ) =   -0.350015203834987 ;
  circC_check( 11, 4 ) =    0.049893457330116 ;
  circC_check( 12, 4 ) =    0.331087436935406 ;
  circC_check( 13, 4 ) =    0.124020599512917 ;
  circC_check( 14, 4 ) =    0.231097918395994 ;
  circC_check( 15, 4 ) =    0.267570088225568 ;

  circC_check(  0, 5 ) =   -0.169502524710522 ;
  circC_check(  1, 5 ) =    0.310272290281873 ;
  circC_check(  2, 5 ) =   -0.297504919764693 ;
  circC_check(  3, 5 ) =    0.191025712185045 ;
  circC_check(  4, 5 ) =    0.352667734613656 ;
  circC_check(  5, 5 ) =   -0.025009377490697 ;
  circC_check(  6, 5 ) =    0.321485188311959 ;
  circC_check(  7, 5 ) =    0.147130125045907 ;
  circC_check(  8, 5 ) =   -0.211591855723580 ;
  circC_check(  9, 5 ) =   -0.283247041628773 ;
  circC_check( 10, 5 ) =   -0.049893457330116 ;
  circC_check( 11, 5 ) =   -0.350015203834987 ;
  circC_check( 12, 5 ) =   -0.124020599512917 ;
  circC_check( 13, 5 ) =    0.331087436935406 ;
  circC_check( 14, 5 ) =   -0.267570088225568 ;
  circC_check( 15, 5 ) =    0.231097918395994 ;

  circC_check(  0, 6 ) =    0.310272290281873 ;
  circC_check(  1, 6 ) =    0.169502524710522 ;
  circC_check(  2, 6 ) =   -0.191025712185045 ;
  circC_check(  3, 6 ) =   -0.297504919764693 ;
  circC_check(  4, 6 ) =   -0.025009377490697 ;
  circC_check(  5, 6 ) =   -0.352667734613656 ;
  circC_check(  6, 6 ) =   -0.147130125045907 ;
  circC_check(  7, 6 ) =    0.321485188311959 ;
  circC_check(  8, 6 ) =   -0.283247041628773 ;
  circC_check(  9, 6 ) =    0.211591855723580 ;
  circC_check( 10, 6 ) =    0.350015203834987 ;
  circC_check( 11, 6 ) =   -0.049893457330116 ;
  circC_check( 12, 6 ) =    0.331087436935406 ;
  circC_check( 13, 6 ) =    0.124020599512917 ;
  circC_check( 14, 6 ) =   -0.231097918395994 ;
  circC_check( 15, 6 ) =   -0.267570088225568 ;

  circC_check(  0, 7 ) =   -0.169502524710522 ;
  circC_check(  1, 7 ) =    0.310272290281873 ;
  circC_check(  2, 7 ) =    0.297504919764693 ;
  circC_check(  3, 7 ) =   -0.191025712185045 ;
  circC_check(  4, 7 ) =    0.352667734613656 ;
  circC_check(  5, 7 ) =   -0.025009377490697 ;
  circC_check(  6, 7 ) =   -0.321485188311959 ;
  circC_check(  7, 7 ) =   -0.147130125045907 ;
  circC_check(  8, 7 ) =   -0.211591855723580 ;
  circC_check(  9, 7 ) =   -0.283247041628773 ;
  circC_check( 10, 7 ) =    0.049893457330116 ;
  circC_check( 11, 7 ) =    0.350015203834987 ;
  circC_check( 12, 7 ) =   -0.124020599512917 ;
  circC_check( 13, 7 ) =    0.331087436935406 ;
  circC_check( 14, 7 ) =    0.267570088225568 ;
  circC_check( 15, 7 ) =   -0.231097918395994 ;

  circC_check(  0, 8 ) =    0.310272290281873 ;
  circC_check(  1, 8 ) =    0.169502524710522 ;
  circC_check(  2, 8 ) =    0.191025712185045 ;
  circC_check(  3, 8 ) =    0.297504919764693 ;
  circC_check(  4, 8 ) =    0.025009377490697 ;
  circC_check(  5, 8 ) =    0.352667734613656 ;
  circC_check(  6, 8 ) =   -0.147130125045907 ;
  circC_check(  7, 8 ) =    0.321485188311959 ;
  circC_check(  8, 8 ) =    0.283247041628773 ;
  circC_check(  9, 8 ) =   -0.211591855723580 ;
  circC_check( 10, 8 ) =    0.350015203834987 ;
  circC_check( 11, 8 ) =   -0.049893457330116 ;
  circC_check( 12, 8 ) =    0.331087436935406 ;
  circC_check( 13, 8 ) =    0.124020599512917 ;
  circC_check( 14, 8 ) =    0.231097918395994 ;
  circC_check( 15, 8 ) =    0.267570088225568 ;

  circC_check(  0, 9 ) =   -0.169502524710522 ;
  circC_check(  1, 9 ) =    0.310272290281873 ;
  circC_check(  2, 9 ) =   -0.297504919764693 ;
  circC_check(  3, 9 ) =    0.191025712185045 ;
  circC_check(  4, 9 ) =   -0.352667734613656 ;
  circC_check(  5, 9 ) =    0.025009377490697 ;
  circC_check(  6, 9 ) =   -0.321485188311959 ;
  circC_check(  7, 9 ) =   -0.147130125045907 ;
  circC_check(  8, 9 ) =    0.211591855723580 ;
  circC_check(  9, 9 ) =    0.283247041628773 ;
  circC_check( 10, 9 ) =    0.049893457330116 ;
  circC_check( 11, 9 ) =    0.350015203834987 ;
  circC_check( 12, 9 ) =   -0.124020599512917 ;
  circC_check( 13, 9 ) =    0.331087436935406 ;
  circC_check( 14, 9 ) =   -0.267570088225568 ;
  circC_check( 15, 9 ) =    0.231097918395994 ;

  circC_check(  0, 10 ) =    0.310272290281873 ;
  circC_check(  1, 10 ) =    0.169502524710522 ;
  circC_check(  2, 10 ) =   -0.191025712185045 ;
  circC_check(  3, 10 ) =   -0.297504919764693 ;
  circC_check(  4, 10 ) =    0.025009377490697 ;
  circC_check(  5, 10 ) =    0.352667734613656 ;
  circC_check(  6, 10 ) =    0.147130125045907 ;
  circC_check(  7, 10 ) =   -0.321485188311959 ;
  circC_check(  8, 10 ) =    0.283247041628773 ;
  circC_check(  9, 10 ) =   -0.211591855723580 ;
  circC_check( 10, 10 ) =   -0.350015203834987 ;
  circC_check( 11, 10 ) =    0.049893457330116 ;
  circC_check( 12, 10 ) =    0.331087436935406 ;
  circC_check( 13, 10 ) =    0.124020599512917 ;
  circC_check( 14, 10 ) =   -0.231097918395994 ;
  circC_check( 15, 10 ) =   -0.267570088225568 ;

  circC_check(  0, 11 ) =   -0.169502524710522 ;
  circC_check(  1, 11 ) =    0.310272290281873 ;
  circC_check(  2, 11 ) =    0.297504919764693 ;
  circC_check(  3, 11 ) =   -0.191025712185045 ;
  circC_check(  4, 11 ) =   -0.352667734613656 ;
  circC_check(  5, 11 ) =    0.025009377490697 ;
  circC_check(  6, 11 ) =    0.321485188311959 ;
  circC_check(  7, 11 ) =    0.147130125045907 ;
  circC_check(  8, 11 ) =    0.211591855723580 ;
  circC_check(  9, 11 ) =    0.283247041628773 ;
  circC_check( 10, 11 ) =   -0.049893457330116 ;
  circC_check( 11, 11 ) =   -0.350015203834987 ;
  circC_check( 12, 11 ) =   -0.124020599512917 ;
  circC_check( 13, 11 ) =    0.331087436935406 ;
  circC_check( 14, 11 ) =    0.267570088225568 ;
  circC_check( 15, 11 ) =   -0.231097918395994 ;

  circC_check(  0, 12 ) =    0.310272290281873 ;
  circC_check(  1, 12 ) =    0.169502524710522 ;
  circC_check(  2, 12 ) =    0.191025712185045 ;
  circC_check(  3, 12 ) =    0.297504919764693 ;
  circC_check(  4, 12 ) =   -0.025009377490697 ;
  circC_check(  5, 12 ) =   -0.352667734613656 ;
  circC_check(  6, 12 ) =    0.147130125045907 ;
  circC_check(  7, 12 ) =   -0.321485188311959 ;
  circC_check(  8, 12 ) =    0.283247041628773 ;
  circC_check(  9, 12 ) =   -0.211591855723580 ;
  circC_check( 10, 12 ) =    0.350015203834987 ;
  circC_check( 11, 12 ) =   -0.049893457330116 ;
  circC_check( 12, 12 ) =   -0.331087436935406 ;
  circC_check( 13, 12 ) =   -0.124020599512917 ;
  circC_check( 14, 12 ) =   -0.231097918395994 ;
  circC_check( 15, 12 ) =   -0.267570088225568 ;

  circC_check(  0, 13 ) =   -0.169502524710522 ;
  circC_check(  1, 13 ) =    0.310272290281873 ;
  circC_check(  2, 13 ) =   -0.297504919764693 ;
  circC_check(  3, 13 ) =    0.191025712185045 ;
  circC_check(  4, 13 ) =    0.352667734613656 ;
  circC_check(  5, 13 ) =   -0.025009377490697 ;
  circC_check(  6, 13 ) =    0.321485188311959 ;
  circC_check(  7, 13 ) =    0.147130125045907 ;
  circC_check(  8, 13 ) =    0.211591855723580 ;
  circC_check(  9, 13 ) =    0.283247041628773 ;
  circC_check( 10, 13 ) =    0.049893457330116 ;
  circC_check( 11, 13 ) =    0.350015203834987 ;
  circC_check( 12, 13 ) =    0.124020599512917 ;
  circC_check( 13, 13 ) =   -0.331087436935406 ;
  circC_check( 14, 13 ) =    0.267570088225568 ;
  circC_check( 15, 13 ) =   -0.231097918395994 ;

  circC_check(  0, 14 ) =    0.310272290281873 ;
  circC_check(  1, 14 ) =    0.169502524710522 ;
  circC_check(  2, 14 ) =   -0.191025712185045 ;
  circC_check(  3, 14 ) =   -0.297504919764693 ;
  circC_check(  4, 14 ) =   -0.025009377490697 ;
  circC_check(  5, 14 ) =   -0.352667734613656 ;
  circC_check(  6, 14 ) =   -0.147130125045907 ;
  circC_check(  7, 14 ) =    0.321485188311959 ;
  circC_check(  8, 14 ) =    0.283247041628773 ;
  circC_check(  9, 14 ) =   -0.211591855723580 ;
  circC_check( 10, 14 ) =   -0.350015203834987 ;
  circC_check( 11, 14 ) =    0.049893457330116 ;
  circC_check( 12, 14 ) =   -0.331087436935406 ;
  circC_check( 13, 14 ) =   -0.124020599512917 ;
  circC_check( 14, 14 ) =    0.231097918395994 ;
  circC_check( 15, 14 ) =    0.267570088225568 ;

  circC_check(  0, 15 ) =   -0.169502524710522 ;
  circC_check(  1, 15 ) =    0.310272290281873 ;
  circC_check(  2, 15 ) =    0.297504919764693 ;
  circC_check(  3, 15 ) =   -0.191025712185045 ;
  circC_check(  4, 15 ) =    0.352667734613656 ;
  circC_check(  5, 15 ) =   -0.025009377490697 ;
  circC_check(  6, 15 ) =   -0.321485188311959 ;
  circC_check(  7, 15 ) =   -0.147130125045907 ;
  circC_check(  8, 15 ) =    0.211591855723580 ;
  circC_check(  9, 15 ) =    0.283247041628773 ;
  circC_check( 10, 15 ) =   -0.049893457330116 ;
  circC_check( 11, 15 ) =   -0.350015203834987 ;
  circC_check( 12, 15 ) =    0.124020599512917 ;
  circC_check( 13, 15 ) =   -0.331087436935406 ;
  circC_check( 14, 15 ) =   -0.267570088225568 ;
  circC_check( 15, 15 ) =    0.231097918395994 ;

  test_qpixl_frqi_check_matrix( circC.matrix() , circC_check  , 10*eps );
}